

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

SUNErrCode
N_VScaleAddMultiVectorArray(int nvec,int nsum,sunrealtype *a,N_Vector *X,N_Vector **Y,N_Vector **Z)

{
  void *__ptr;
  void *__ptr_00;
  long *in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  long in_R8;
  long in_R9;
  N_Vector *ZZ;
  N_Vector *YY;
  int ier;
  int j;
  int i;
  int local_34;
  int local_30;
  int local_2c;
  
  if (*(long *)(*(long *)(*in_RCX + 8) + 0x130) == 0) {
    if (*(long *)(*(long *)(*in_RCX + 8) + 0xf8) == 0) {
      for (local_2c = 0; local_2c < in_EDI; local_2c = local_2c + 1) {
        for (local_30 = 0; local_30 < in_ESI; local_30 = local_30 + 1) {
          (**(code **)(*(long *)(*in_RCX + 8) + 0x58))
                    (*(undefined8 *)(in_RDX + (long)local_30 * 8),0x3ff0000000000000,
                     in_RCX[local_2c],
                     *(undefined8 *)(*(long *)(in_R8 + (long)local_30 * 8) + (long)local_2c * 8),
                     *(undefined8 *)(*(long *)(in_R9 + (long)local_30 * 8) + (long)local_2c * 8));
        }
      }
      local_34 = 0;
    }
    else {
      __ptr = malloc((long)in_ESI << 3);
      __ptr_00 = malloc((long)in_ESI << 3);
      for (local_2c = 0; local_2c < in_EDI; local_2c = local_2c + 1) {
        for (local_30 = 0; local_30 < in_ESI; local_30 = local_30 + 1) {
          *(undefined8 *)((long)__ptr + (long)local_30 * 8) =
               *(undefined8 *)(*(long *)(in_R8 + (long)local_30 * 8) + (long)local_2c * 8);
          *(undefined8 *)((long)__ptr_00 + (long)local_30 * 8) =
               *(undefined8 *)(*(long *)(in_R9 + (long)local_30 * 8) + (long)local_2c * 8);
        }
        local_34 = (**(code **)(*(long *)(*in_RCX + 8) + 0xf8))
                             (in_ESI,in_RDX,in_RCX[local_2c],__ptr,__ptr_00);
        if (local_34 != 0) break;
      }
      free(__ptr);
      free(__ptr_00);
    }
  }
  else {
    local_34 = (**(code **)(*(long *)(*in_RCX + 8) + 0x130))
                         (in_EDI,in_ESI,in_RDX,in_RCX,in_R8,in_R9,0,0);
  }
  return local_34;
}

Assistant:

SUNErrCode N_VScaleAddMultiVectorArray(int nvec, int nsum, sunrealtype* a,
                                       N_Vector* X, N_Vector** Y, N_Vector** Z)
{
  int i, j, ier;
  N_Vector* YY = NULL;
  N_Vector* ZZ = NULL;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(X[0]));

  if (X[0]->ops->nvscaleaddmultivectorarray != NULL)
  {
    ier = X[0]->ops->nvscaleaddmultivectorarray(nvec, nsum, a, X, Y, Z);
  }
  else if (X[0]->ops->nvscaleaddmulti != NULL)
  {
    /* allocate arrays of vectors */
    YY = (N_Vector*)malloc(nsum * sizeof(N_Vector));
    ZZ = (N_Vector*)malloc(nsum * sizeof(N_Vector));

    for (i = 0; i < nvec; i++)
    {
      for (j = 0; j < nsum; j++)
      {
        YY[j] = Y[j][i];
        ZZ[j] = Z[j][i];
      }

      ier = X[0]->ops->nvscaleaddmulti(nsum, a, X[i], YY, ZZ);
      if (ier != 0) { break; }
    }

    /* free array of vectors */
    free(YY);
    free(ZZ);
  }
  else
  {
    for (i = 0; i < nvec; i++)
    {
      for (j = 0; j < nsum; j++)
      {
        X[0]->ops->nvlinearsum(a[j], X[i], SUN_RCONST(1.0), Y[j][i], Z[j][i]);
      }
    }
    ier = SUN_SUCCESS;
  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(X[0]));
  return (ier);
}